

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<3UL>::DeleteProperty
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  ScriptContext *scriptContext_00;
  PropertyOperationFlags flags;
  bool bVar2;
  byte bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  PropertyRecord *this_00;
  char16 *varName;
  SimpleTypeHandler<3UL> *this_01;
  uint32 local_38;
  ushort local_32;
  uint32 indexVal;
  PropertyIndex index;
  ScriptContext *scriptContext;
  PropertyOperationFlags propertyOperationFlags_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<3UL> *this_local;
  
  scriptContext._0_4_ = propertyOperationFlags;
  scriptContext._4_4_ = propertyId;
  _propertyOperationFlags_local = instance;
  instance_local = (DynamicObject *)this;
  _indexVal = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  BVar4 = GetDescriptor(this,scriptContext._4_4_,&local_32);
  flags = (PropertyOperationFlags)scriptContext;
  scriptContext_00 = _indexVal;
  if (BVar4 == 0) {
    bVar2 = DynamicObject::HasObjectArray(_propertyOperationFlags_local);
    if ((bVar2) &&
       (BVar4 = ScriptContext::IsNumericPropertyId(_indexVal,scriptContext._4_4_,&local_38),
       BVar4 != 0)) {
      this_local._4_4_ =
           DynamicTypeHandler::DeleteItem
                     (&this->super_DynamicTypeHandler,_propertyOperationFlags_local,local_38,
                      (PropertyOperationFlags)scriptContext);
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else if ((this->descriptors[local_32].field_1.Attributes & 8) == 0) {
    if ((this->descriptors[local_32].field_1.Attributes & 2) == 0) {
      this_00 = ScriptContext::GetPropertyName(_indexVal,scriptContext._4_4_);
      varName = PropertyRecord::GetBuffer(this_00);
      JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(flags,scriptContext_00,varName);
      this_local._4_4_ = 0;
    }
    else {
      bVar3 = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
      if (((bVar3 & 0x20) != 0) ||
         (BVar4 = Js::JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty
                            (&_propertyOperationFlags_local->super_RecyclableObject,
                             scriptContext._4_4_), BVar4 != 0)) {
        ScriptContext::InvalidateProtoCaches(_indexVal,scriptContext._4_4_);
      }
      DynamicObject::ChangeType(_propertyOperationFlags_local);
      bVar2 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
      if (bVar2) {
        this_01 = ConvertToNonSharedSimpleType(this,_propertyOperationFlags_local);
        SetAttribute(this_01,_propertyOperationFlags_local,local_32,'\b');
      }
      else {
        SetAttribute(this,_propertyOperationFlags_local,local_32,'\b');
      }
      this_local._4_4_ = 1;
    }
  }
  else {
    bVar2 = DynamicTypeHandler::GetIsLocked(&this->super_DynamicTypeHandler);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                  ,0x298,"(!GetIsLocked())","!GetIsLocked()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleTypeHandler<size>::DeleteProperty(DynamicObject* instance, PropertyId propertyId, PropertyOperationFlags propertyOperationFlags)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        PropertyIndex index;
        if (GetDescriptor(propertyId, &index))
        {
            if (descriptors[index].Attributes & PropertyDeleted)
            {
                // A locked type should not have deleted properties
                Assert(!GetIsLocked());
                return true;
            }
            if (!(descriptors[index].Attributes & PropertyConfigurable))
            {
                JavascriptError::ThrowCantDeleteIfStrictModeOrNonconfigurable(
                    propertyOperationFlags, scriptContext, scriptContext->GetPropertyName(propertyId)->GetBuffer());

                return false;
            }

            if ((this->GetFlags() & IsPrototypeFlag)
                || JavascriptOperators::HasProxyOrPrototypeInlineCacheProperty(instance, propertyId))
            {
                // We don't evolve dictionary types when deleting a field, so we need to invalidate prototype caches.
                // We only have to do this though if the current type is used as a prototype, or the current property
                // is found on the prototype chain.)
                scriptContext->InvalidateProtoCaches(propertyId);
            }

            instance->ChangeType();


            CompileAssert(_countof(descriptors) == size);
            if (size > 1)
            {
                if (GetIsLocked())
                {
                    // Prevent conversion to path type and then dictionary. Remove this when path types support deleted properties.
                    this->ConvertToNonSharedSimpleType(instance)->SetAttribute(instance, index, PropertyDeleted);
                }
                else
                {
                    SetAttribute(instance, index, PropertyDeleted);
                }
            }
            else
            {
                SetSlotUnchecked(instance, index, nullptr);

                NullTypeHandlerBase* nullTypeHandler = ((this->GetFlags() & IsPrototypeFlag) != 0) ?
                    (NullTypeHandlerBase*)NullTypeHandler<true>::GetDefaultInstance() : (NullTypeHandlerBase*)NullTypeHandler<false>::GetDefaultInstance();
                if (instance->HasReadOnlyPropertiesInvisibleToTypeHandler())
                {
                    nullTypeHandler->ClearHasOnlyWritableDataProperties();
                }
                SetInstanceTypeHandler(instance, nullTypeHandler, false);
            }

            return true;
        }

        // Check numeric propertyId only if objectArray available
        uint32 indexVal;
        if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            return SimpleTypeHandler<size>::DeleteItem(instance, indexVal, propertyOperationFlags);
        }

        return true;
    }